

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec3 vec3_rotate_z(vec3 v,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  undefined4 local_28;
  
  fVar4 = v.z;
  fVar3 = v.y;
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  local_28 = v.x;
  fVar6 = local_28 * 0.0 + fVar3 * 0.0 + fVar4;
  fVar5 = fVar6 * 0.0 * (1.0 - fVar1);
  vVar7.x = fVar2 * (fVar4 * 0.0 - fVar3) + fVar5 + fVar1 * local_28;
  vVar7.y = fVar2 * (local_28 - fVar4 * 0.0) + fVar5 + fVar1 * fVar3;
  vVar7.z = (local_28 * -0.0 + fVar3 * 0.0) * fVar2 + (1.0 - fVar1) * fVar6 + fVar1 * fVar4;
  return vVar7;
}

Assistant:

vec3 vec3_rotate_z(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(0.0f, 0.0f, 1.0f), theta);
}